

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# qlocalsocket_unix.cpp
# Opt level: O1

bool QLocalSocketPrivate::parseSockaddr
               (sockaddr_un *addr,uint len,QString *fullServerName,QString *serverName,
               bool *abstractNamespace)

{
  char16_t cVar1;
  QArrayData *pQVar2;
  uint uVar3;
  bool bVar5;
  char16_t *pcVar6;
  long in_FS_OFFSET;
  QStringView QVar7;
  QByteArrayView in;
  QStringDecoder toUtf16;
  QArrayData *local_a8;
  char16_t *local_a0;
  undefined1 *puStack_98;
  QString local_88;
  QStringDecoder local_68;
  long local_30;
  undefined1 *puVar4;
  
  local_30 = *(long *)(in_FS_OFFSET + 0x28);
  if (2 < len) {
    bVar5 = addr->sun_path[0] == '\0' && addr->sun_family == 1;
    *abstractNamespace = bVar5;
    local_68.super_QStringConverter.iface = (Interface *)QtPrivate::indexOf;
    local_68.super_QStringConverter.state.flags.
    super_QFlagsStorageHelper<QStringConverterBase::Flag,_4>.
    super_QFlagsStorage<QStringConverterBase::Flag>.i =
         (QFlagsStorageHelper<QStringConverterBase::Flag,_4>)
         (QFlagsStorage<QStringConverterBase::Flag>)0x1;
    local_68.super_QStringConverter.state.internalState = 0;
    local_68.super_QStringConverter.state.remainingChars._0_4_ = 0;
    local_68.super_QStringConverter.state.remainingChars._4_4_ = 0;
    local_68.super_QStringConverter.state.invalidChars._0_4_ = 0;
    local_68.super_QStringConverter.state.invalidChars._4_4_ = 0;
    local_68.super_QStringConverter.state.field_4.state_data[0] = 0;
    local_68.super_QStringConverter.state.field_4.state_data[1] = 0;
    local_68.super_QStringConverter.state.field_4.state_data[2] = 0;
    local_68.super_QStringConverter.state.field_4.state_data[3] = 0;
    local_68.super_QStringConverter.state.clearFn = (ClearDataFn)0x0;
    in.m_data = addr->sun_path + bVar5;
    in.m_size = (ulong)((len - bVar5) - 2);
    local_88.d.size = (qsizetype)&DAT_aaaaaaaaaaaaaaaa;
    local_88.d.d = (Data *)&DAT_aaaaaaaaaaaaaaaa;
    local_88.d.ptr = (char16_t *)&DAT_aaaaaaaaaaaaaaaa;
    QStringDecoder::decodeAsString(&local_88,&local_68,in);
    if (((undefined1 *)local_88.d.size != (undefined1 *)0x0) &&
       (CONCAT44(local_68.super_QStringConverter.state.invalidChars._4_4_,
                 (undefined4)local_68.super_QStringConverter.state.invalidChars) == 0)) {
      if ((*abstractNamespace == false) && (local_88.d.ptr[(long)(local_88.d.size + -1)] == L'\0'))
      {
        pcVar6 = local_88.d.ptr + ((local_88.d.size & 0xffffffffU) - 2);
        puVar4 = (undefined1 *)local_88.d.size;
        do {
          uVar3 = (int)puVar4 - 1;
          puVar4 = (undefined1 *)(ulong)uVar3;
          if ((int)uVar3 < 1) break;
          cVar1 = *pcVar6;
          pcVar6 = pcVar6 + -1;
        } while (cVar1 == L'\0');
        QString::truncate((longlong)&local_88);
      }
      QString::operator=(fullServerName,(QString *)&local_88);
      if (*abstractNamespace == true) {
        local_a8 = &(local_88.d.d)->super_QArrayData;
        local_a0 = local_88.d.ptr;
        puStack_98 = (undefined1 *)local_88.d.size;
        if (&(local_88.d.d)->super_QArrayData != (QArrayData *)0x0) {
          LOCK();
          ((local_88.d.d)->super_QArrayData).ref_._q_value.super___atomic_base<int>._M_i =
               ((local_88.d.d)->super_QArrayData).ref_._q_value.super___atomic_base<int>._M_i + 1;
          UNLOCK();
        }
      }
      else {
        QVar7.m_data = (fullServerName->d).ptr;
        QVar7.m_size = (fullServerName->d).size;
        QtPrivate::lastIndexOf(QVar7,-1,L'/',CaseSensitive);
        QString::mid((longlong)&local_a8,(longlong)fullServerName);
      }
      pQVar2 = &((serverName->d).d)->super_QArrayData;
      pcVar6 = (serverName->d).ptr;
      (serverName->d).d = (Data *)local_a8;
      (serverName->d).ptr = local_a0;
      puVar4 = (undefined1 *)(serverName->d).size;
      (serverName->d).size = (qsizetype)puStack_98;
      local_a8 = pQVar2;
      local_a0 = pcVar6;
      puStack_98 = puVar4;
      if (pQVar2 != (QArrayData *)0x0) {
        LOCK();
        (pQVar2->ref_)._q_value.super___atomic_base<int>._M_i =
             (pQVar2->ref_)._q_value.super___atomic_base<int>._M_i + -1;
        UNLOCK();
        if ((pQVar2->ref_)._q_value.super___atomic_base<int>._M_i == 0) {
          QArrayData::deallocate(pQVar2,2,0x10);
        }
      }
      if ((serverName->d).size == 0) {
        QString::operator=(serverName,(QString *)fullServerName);
      }
    }
    if (&(local_88.d.d)->super_QArrayData != (QArrayData *)0x0) {
      LOCK();
      ((local_88.d.d)->super_QArrayData).ref_._q_value.super___atomic_base<int>._M_i =
           ((local_88.d.d)->super_QArrayData).ref_._q_value.super___atomic_base<int>._M_i + -1;
      UNLOCK();
      if (((local_88.d.d)->super_QArrayData).ref_._q_value.super___atomic_base<int>._M_i == 0) {
        QArrayData::deallocate(&(local_88.d.d)->super_QArrayData,2,0x10);
      }
    }
    QStringConverterBase::State::clear();
  }
  if (*(long *)(in_FS_OFFSET + 0x28) != local_30) {
    __stack_chk_fail();
  }
  return 2 < len;
}

Assistant:

bool QLocalSocketPrivate::parseSockaddr(const struct ::sockaddr_un &addr,
                                        uint len,
                                        QString &fullServerName,
                                        QString &serverName,
                                        bool &abstractNamespace)
{
    if (len <= offsetof(::sockaddr_un, sun_path))
        return false;
    len -= offsetof(::sockaddr_un, sun_path);
    // check for abstract socket address
    abstractNamespace = PlatformSupportsAbstractNamespace
                                 && (addr.sun_family == PF_UNIX && addr.sun_path[0] == 0);
    QStringDecoder toUtf16(QStringDecoder::System, QStringDecoder::Flag::Stateless);
    // An abstract socket address can be arbitrary binary. To properly handle such a case,
    // we'd have to add new access functions for this very specific case. Instead, we just
    // attempt to decode it according to OS text encoding. If it fails we ignore the result.
    QByteArrayView textData(addr.sun_path + (abstractNamespace ? 1 : 0),
                            len - (abstractNamespace ? 1 : 0));
    QString name = toUtf16(textData);
    if (!name.isEmpty() && !toUtf16.hasError()) {
        //conversion encodes the trailing zeros. So, in case of non-abstract namespace we
        //chop them off as \0 character is not allowed in filenames
        if (!abstractNamespace && (name.at(name.size() - 1) == QChar::fromLatin1('\0'))) {
            int truncPos = name.size() - 1;
            while (truncPos > 0 && name.at(truncPos - 1) == QChar::fromLatin1('\0'))
                truncPos--;
            name.truncate(truncPos);
        }
        fullServerName = name;
        serverName = abstractNamespace
                     ? name
                     : fullServerName.mid(fullServerName.lastIndexOf(u'/') + 1);
        if (serverName.isEmpty())
            serverName = fullServerName;
    }
    return true;
}